

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O1

bool __thiscall
JsonModelSerialiserPrivate::roleForObject
          (JsonModelSerialiserPrivate *this,QJsonObject *source,QModelIndex *destination)

{
  QAbstractItemModel *pQVar1;
  undefined1 uVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QJsonValue tempValue;
  QJsonValue local_80 [24];
  QString local_68;
  QVariant local_50;
  
  QVar6.m_data = (char *)source;
  QVar6.m_size = (qsizetype)local_80;
  QJsonObject::value(QVar6);
  iVar3 = QJsonValue::type();
  if (iVar3 != 0x80) {
    iVar3 = QJsonValue::type();
    if (iVar3 == 2) {
      uVar4 = QJsonValue::toInt((int)local_80);
      QVar7.m_data = (char *)source;
      QVar7.m_size = (qsizetype)&local_50;
      QJsonObject::value(QVar7);
      QJsonValue::swap(local_80);
      QJsonValue::~QJsonValue((QJsonValue *)&local_50);
      iVar3 = QJsonValue::type();
      if (iVar3 != 0x80) {
        iVar3 = QJsonValue::type();
        if (iVar3 == 2) {
          iVar3 = QJsonValue::toInt((int)local_80);
          QVar8.m_data = (char *)source;
          QVar8.m_size = (qsizetype)&local_50;
          QJsonObject::value(QVar8);
          QJsonValue::swap(local_80);
          QJsonValue::~QJsonValue((QJsonValue *)&local_50);
          iVar5 = QJsonValue::type();
          if (iVar5 != 0x80) {
            iVar5 = QJsonValue::type();
            if (iVar5 == 3) {
              pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                       super_AbstractModelSerialiserPrivate.m_model;
              QJsonValue::toString();
              AbstractStringSerialiserPrivate::loadVariant
                        (&local_50,&this->super_AbstractStringSerialiserPrivate,iVar3,&local_68);
              uVar2 = (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,destination,&local_50,uVar4);
              ::QVariant::~QVariant(&local_50);
              if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
                }
              }
              goto LAB_00128854;
            }
          }
        }
      }
    }
  }
  uVar2 = 0;
LAB_00128854:
  QJsonValue::~QJsonValue(local_80);
  return (bool)uVar2;
}

Assistant:

bool JsonModelSerialiserPrivate::roleForObject(const QJsonObject &source, const QModelIndex &destination)
{
    QJsonValue tempValue = source.value(QLatin1String("role"));
    if (tempValue.isUndefined() || !tempValue.isDouble())
        return false;
    const int tempRole =
#if (QT_VERSION >= QT_VERSION_CHECK(5, 2, 0))
            tempValue.toInt();
#else
            static_cast<int>(tempValue.toDouble());
#endif
    tempValue = source.value(QLatin1String("type"));
    if (tempValue.isUndefined() || !tempValue.isDouble())
        return false;
    const int tempType =
#if (QT_VERSION >= QT_VERSION_CHECK(5, 2, 0))
            tempValue.toInt();
#else
            static_cast<int>(tempValue.toDouble());
#endif
    tempValue = source.value(QLatin1String("value"));
    if (tempValue.isUndefined() || !tempValue.isString())
        return false;
    if (!m_model->setData(destination, loadVariant(tempType, tempValue.toString()), tempRole))
        return false;
    return true;
}